

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O0

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::timestamp_t,duckdb::dtime_tz_t>
          (BaseAppender *this,Vector *col,timestamp_t input)

{
  dtime_tz_t dVar1;
  dtime_tz_t *pdVar2;
  idx_t iVar3;
  long in_RDI;
  timestamp_t in_stack_00000008;
  
  dVar1 = Cast::Operation<duckdb::timestamp_t,duckdb::dtime_tz_t>(in_stack_00000008);
  pdVar2 = FlatVector::GetData<duckdb::dtime_tz_t>((Vector *)0x94c4ef);
  iVar3 = DataChunk::size((DataChunk *)(in_RDI + 0x48));
  pdVar2[iVar3].bits = dVar1.bits;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}